

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_zip_compression_store.c
# Opt level: O3

void verify_write_uncompressed(archive *a)

{
  int iVar1;
  archive_entry *paVar2;
  la_ssize_t lVar3;
  
  paVar2 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                   ,L'7',(uint)(paVar2 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_pathname(paVar2,"file");
  archive_entry_set_mode(paVar2,0x81a4);
  archive_entry_set_size(paVar2,10);
  archive_entry_set_uid(paVar2,10);
  archive_entry_set_gid(paVar2,0x14);
  archive_entry_set_mtime(paVar2,now,0);
  archive_entry_set_atime(paVar2,now + 3,0);
  iVar1 = archive_write_header(a,paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'?',0,"0",(long)iVar1,"archive_write_header(a, entry)",a);
  lVar3 = archive_write_data(a,"12345",5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'@',5,"sizeof(file_data1)",lVar3,
                      "archive_write_data(a, file_data1, sizeof(file_data1))",a);
  lVar3 = archive_write_data(a,"67890",5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'A',5,"sizeof(file_data2)",lVar3,
                      "archive_write_data(a, file_data2, sizeof(file_data2))",a);
  archive_entry_free(paVar2);
  paVar2 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                   ,L'E',(uint)(paVar2 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_pathname(paVar2,"folder/");
  archive_entry_set_mode(paVar2,0x41ed);
  archive_entry_set_size(paVar2,0);
  archive_entry_set_uid(paVar2,0x1e);
  archive_entry_set_gid(paVar2,0x28);
  archive_entry_set_mtime(paVar2,now,0);
  archive_entry_set_ctime(paVar2,now + 5,0);
  iVar1 = archive_write_header(a,paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'M',0,"0",(long)iVar1,"archive_write_header(a, entry)",a);
  archive_entry_free(paVar2);
  return;
}

Assistant:

static void verify_write_uncompressed(struct archive *a)
{
	struct archive_entry *entry;

	/* Write entries. */

	/* Regular file */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_pathname(entry, file_name);
	archive_entry_set_mode(entry, S_IFREG | 0644);
	archive_entry_set_size(entry, sizeof(file_data1) + sizeof(file_data2));
	archive_entry_set_uid(entry, file_uid);
	archive_entry_set_gid(entry, file_gid);
	archive_entry_set_mtime(entry, now, 0);
	archive_entry_set_atime(entry, now + 3, 0);
	assertEqualIntA(a, 0, archive_write_header(a, entry));
	assertEqualIntA(a, sizeof(file_data1), archive_write_data(a, file_data1, sizeof(file_data1)));
	assertEqualIntA(a, sizeof(file_data2), archive_write_data(a, file_data2, sizeof(file_data2)));
	archive_entry_free(entry);

	/* Folder */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_pathname(entry, folder_name);
	archive_entry_set_mode(entry, S_IFDIR | folder_perm);
	archive_entry_set_size(entry, 0);
	archive_entry_set_uid(entry, folder_uid);
	archive_entry_set_gid(entry, folder_gid);
	archive_entry_set_mtime(entry, now, 0);
	archive_entry_set_ctime(entry, now + 5, 0);
	assertEqualIntA(a, 0, archive_write_header(a, entry));
	archive_entry_free(entry);
}